

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print_number_of_quasiparticles(void)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  uint uVar4;
  pointer psVar5;
  ostream *poVar6;
  undefined8 auStack_60 [3];
  int *local_48;
  int local_40;
  int local_3c;
  int j_1;
  int N_qp_i;
  int i;
  int j;
  unsigned_long __vla_expr0;
  uint local_1c;
  int local_18;
  int count;
  int N_qp_i_total;
  int N_qp_g_total;
  int N_qp_p_total;
  int N_qp_e_total;
  
  N_qp_g_total = 0;
  N_qp_i_total = 0;
  count = 0;
  local_18 = 0;
  local_1c = n_ion_populations + 3;
  __vla_expr0 = (unsigned_long)&local_48;
  lVar2 = -((ulong)local_1c * 4 + 0xf & 0xfffffffffffffff0);
  local_48 = (int *)((long)&local_48 + lVar2);
  _i = (ulong)local_1c;
  *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a6a3;
  psVar5 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                     (*(unique_ptr<spatial_region,_std::default_delete<spatial_region>_> **)
                       ((long)auStack_60 + lVar2 + 0x10));
  *local_48 = psVar5->N_qp_e;
  *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a6be;
  psVar5 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                     (*(unique_ptr<spatial_region,_std::default_delete<spatial_region>_> **)
                       ((long)auStack_60 + lVar2 + 0x10));
  local_48[1] = psVar5->N_qp_p;
  *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a6da;
  psVar5 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                     (*(unique_ptr<spatial_region,_std::default_delete<spatial_region>_> **)
                       ((long)auStack_60 + lVar2 + 0x10));
  local_48[2] = psVar5->N_qp_g;
  for (N_qp_i = 0; uVar4 = local_1c, piVar3 = local_48, N_qp_i < n_ion_populations;
      N_qp_i = N_qp_i + 1) {
    *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a708;
    psVar5 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                       (*(unique_ptr<spatial_region,_std::default_delete<spatial_region>_> **)
                         ((long)auStack_60 + lVar2 + 0x10));
    local_48[N_qp_i + 3] = psVar5->N_qp_i[N_qp_i];
  }
  if (mpi_rank == 0) {
    for (j_1 = 0; uVar4 = local_1c, iVar1 = j_1, piVar3 = local_48, j_1 < n_sr; j_1 = j_1 + 1) {
      if (j_1 != 0) {
        *(undefined8 *)((long)auStack_60 + lVar2 + 8) = 0;
        *(undefined8 *)((long)auStack_60 + lVar2) = 0x14a78b;
        MPI_Recv(piVar3,uVar4,&ompi_mpi_int,iVar1,0,&ompi_mpi_comm_world);
      }
      N_qp_g_total = *local_48 + N_qp_g_total;
      N_qp_i_total = local_48[1] + N_qp_i_total;
      count = local_48[2] + count;
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a7c0;
      poVar6 = std::operator<<((ostream *)&std::cout," Thread #");
      iVar1 = j_1;
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a7cb;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar1);
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a7da;
      poVar6 = std::operator<<(poVar6,":\t");
      iVar1 = *local_48;
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a7e8;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar1);
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a7f7;
      poVar6 = std::operator<<(poVar6," e, ");
      iVar1 = local_48[1];
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a806;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar1);
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a815;
      poVar6 = std::operator<<(poVar6," p, ");
      iVar1 = local_48[2];
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a824;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar1);
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a833;
      std::operator<<(poVar6," g");
      if (-1 < n_ion_populations) {
        local_3c = 0;
        for (local_40 = 0; local_40 < n_ion_populations; local_40 = local_40 + 1) {
          local_3c = local_48[local_40 + 3] + local_3c;
        }
        local_18 = local_3c + local_18;
        *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a892;
        poVar6 = std::operator<<((ostream *)&std::cout,", ");
        iVar1 = local_3c;
        *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a89d;
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar1);
        *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a8ac;
        std::operator<<(poVar6," i");
      }
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a8bf;
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    }
    *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a8e0;
    poVar6 = std::operator<<((ostream *)&std::cout,"Total:  \t");
    iVar1 = N_qp_g_total;
    *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a8eb;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar1);
    *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a8fa;
    poVar6 = std::operator<<(poVar6," e, ");
    iVar1 = N_qp_i_total;
    *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a905;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar1);
    *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a914;
    poVar6 = std::operator<<(poVar6," p, ");
    iVar1 = count;
    *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a91f;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar1);
    *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a92e;
    std::operator<<(poVar6," g");
    if (-1 < n_ion_populations) {
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a94a;
      poVar6 = std::operator<<((ostream *)&std::cout,", ");
      iVar1 = local_18;
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a955;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar1);
      *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a964;
      std::operator<<(poVar6," i");
    }
    *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a977;
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  else {
    *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x14a999;
    MPI_Send(piVar3,uVar4,&ompi_mpi_int,0,0,&ompi_mpi_comm_world);
  }
  return;
}

Assistant:

void print_number_of_quasiparticles()
{
    // logging number of pseudoparticles in each thread
    int N_qp_e_total = 0;
    int N_qp_p_total = 0;
    int N_qp_g_total = 0;
    int N_qp_i_total = 0;

    int count = 3 + n_ion_populations;
    int data[count];
    data[0] = psr->N_qp_e;
    data[1] = psr->N_qp_p;
    data[2] = psr->N_qp_g;
    for (int j=0; j<n_ion_populations; j++) {
        data[3+j] = psr->N_qp_i[j];
    }

    if (mpi_rank == 0) {
        for (int i=0; i<n_sr; i++) {
            if (i != 0) {
                MPI_Recv(data, count, MPI_INT, i, 0, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
            }
            N_qp_e_total += data[0];
            N_qp_p_total += data[1];
            N_qp_g_total += data[2];
            cout << " Thread #" << i << ":\t" << data[0] << " e, " << data[1] << " p, " << data[2] << " g";
            if (n_ion_populations >= 0)
            {
                int N_qp_i = 0;
                for (int j=0; j<n_ion_populations; j++)
                {
                    N_qp_i += data[3+j];
                }
                N_qp_i_total += N_qp_i;
                cout << ", " << N_qp_i << " i";
            }
            cout << endl;
        }
        cout << "Total:  \t" << N_qp_e_total << " e, " << N_qp_p_total << " p, " << N_qp_g_total << " g";
        if (n_ion_populations >= 0)
        {
            cout << ", " << N_qp_i_total << " i";
        }
        cout << endl;
    } else {
        MPI_Send(data, count, MPI_INT, 0, 0, MPI_COMM_WORLD);
    }
}